

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyscope.cpp
# Opt level: O0

void polyscope::pushContext(function<void_()> *callbackFunction,bool drawDefaultUI)

{
  bool bVar1;
  uint uVar2;
  ImGuiContext *ctx;
  ImGuiIO *__x;
  size_type sVar3;
  runtime_error *this;
  size_type sVar4;
  reference pvVar5;
  function<void_()> *in_RDI;
  size_t currentContextStackSize;
  ImGuiIO *oldIO;
  ImGuiContext *newContext;
  Engine *in_stack_00000230;
  ImGuiIO *in_stack_ffffffffffffff78;
  Engine **this_00;
  ImFontAtlas *in_stack_ffffffffffffffb0;
  
  this_00 = &render::engine;
  render::Engine::getImGuiGlobalFontAtlas(render::engine);
  ctx = ImGui::CreateContext(in_stack_ffffffffffffffb0);
  __x = ImGui::GetIO();
  ImGui::SetCurrentContext(ctx);
  render::Engine::setImGuiStyle(in_stack_00000230);
  ImGui::GetIO();
  ImGuiIO::operator=((ImGuiIO *)this_00,in_stack_ffffffffffffff78);
  std::function<void_()>::function(in_RDI,(function<void_()> *)__x);
  std::
  vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
  ::push_back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
               *)this_00,(value_type *)in_stack_ffffffffffffff78);
  anon_unknown_1::ContextEntry::~ContextEntry((ContextEntry *)0x32e0fb);
  sVar3 = std::
          vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
          ::size((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                  *)(anonymous_namespace)::contextStack);
  if (sVar3 < 0x33) {
    (*render::engine->_vptr_Engine[0xf])();
    sVar3 = std::
            vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
            ::size((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                    *)(anonymous_namespace)::contextStack);
    while (sVar4 = std::
                   vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                   ::size((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                           *)(anonymous_namespace)::contextStack), sVar3 <= sVar4) {
      mainLoopIteration();
      uVar2 = (*render::engine->_vptr_Engine[0x13])();
      if ((uVar2 & 1) != 0) {
        popContext();
      }
    }
    ImGui::GetIO();
    ImGuiIO::operator=((ImGuiIO *)this_00,in_stack_ffffffffffffff78);
    ImGui::DestroyContext((ImGuiContext *)0x32e1f4);
    bVar1 = std::
            vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
            ::empty((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                     *)in_RDI);
    if (!bVar1) {
      pvVar5 = std::
               vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
               ::back((vector<polyscope::(anonymous_namespace)::ContextEntry,_std::allocator<polyscope::(anonymous_namespace)::ContextEntry>_>
                       *)this_00);
      ImGui::SetCurrentContext(pvVar5->context);
    }
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,
             "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps you are accidentally calling show every time polyscope::userCallback executes?"
            );
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void pushContext(std::function<void()> callbackFunction, bool drawDefaultUI) {

  // Create a new context and push it on to the stack
  ImGuiContext* newContext = ImGui::CreateContext(render::engine->getImGuiGlobalFontAtlas());
  ImGuiIO& oldIO = ImGui::GetIO(); // used to copy below, see note
  ImGui::SetCurrentContext(newContext);

  render::engine->setImGuiStyle();
  ImGui::GetIO() = oldIO; // Copy all of the old IO values to new. With ImGUI 1.76 (and some previous versions), this
                          // was necessary to fix a bug where keys like delete, etc would break in subcontexts. The
                          // problem was that the key mappings (e.g. GLFW_KEY_BACKSPACE --> ImGuiKey_Backspace) need to
                          // be populated in io.KeyMap, and these entries would get lost on creating a new context.
  contextStack.push_back(ContextEntry{newContext, callbackFunction, drawDefaultUI});

  if (contextStack.size() > 50) {
    // Catch bugs with nested show()
    throw std::runtime_error(
        "Uh oh, polyscope::show() was recusively MANY times (depth > 50), this is probably a bug. Perhaps "
        "you are accidentally calling show every time polyscope::userCallback executes?");
  };

  // Make sure the window is visible
  render::engine->showWindow();

  // Re-enter main loop until the context has been popped
  size_t currentContextStackSize = contextStack.size();
  while (contextStack.size() >= currentContextStackSize) {

    mainLoopIteration();

    // auto-exit if the window is closed
    if (render::engine->windowRequestsClose()) {
      popContext();
    }
  }

  oldIO = ImGui::GetIO(); // Copy new IO values to old. I haven't encountered anything that strictly requires this, but
                          // it feels like we should mirror the behavior from pushing.

  ImGui::DestroyContext(newContext);

  // Restore the previous context, if there was one
  if (!contextStack.empty()) {
    ImGui::SetCurrentContext(contextStack.back().context);
  }
}